

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void ssh_proto_error(Ssh *ssh,char *fmt,...)

{
  char in_AL;
  char *ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (*(long *)(ssh + 6) != 0) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_e8.gp_offset = 0x10;
    local_e8.fp_offset = 0x30;
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    ptr = dupvprintf(fmt,&local_e8);
    (**(code **)(**(long **)(ssh + 4) + 0x20))(*(long **)(ssh + 4),ptr,2);
    if (*(PacketProtocolLayer **)(ssh + 6) != (PacketProtocolLayer *)0x0) {
      ssh_ppl_free(*(PacketProtocolLayer **)(ssh + 6));
      *(undefined8 *)(ssh + 6) = 0;
    }
    *(undefined8 *)(ssh + 8) = 0;
    (**(code **)(**(long **)(ssh + 4) + 0x10))();
    *(undefined1 *)&ssh[-0x36].dummy = 1;
    queue_idempotent_callback((IdempotentCallback *)(ssh + -0x3c));
    *(undefined1 *)(*(long *)(ssh + 4) + 0xde) = 1;
    logeventf(*(LogContext **)(ssh + -0x26),"Protocol error: %s",ptr);
    safefree(ptr);
  }
  return;
}

Assistant:

void ssh_proto_error(Ssh *ssh, const char *fmt, ...)
{
    server *srv = container_of(ssh, server, ssh);
    if (srv->base_layer) {
        GET_FORMATTED_MSG(fmt);
        ssh_bpp_queue_disconnect(srv->bpp, msg,
                                 SSH2_DISCONNECT_PROTOCOL_ERROR);
        server_initiate_connection_close(srv);
        logeventf(srv->logctx, "Protocol error: %s", msg);
        sfree(msg);
    }
}